

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

void __thiscall kj::Path::validatePart(Path *this,StringPtr part)

{
  char *__s;
  size_t sVar1;
  void *pvVar2;
  bool local_71;
  Fault f_1;
  Fault f;
  char local_48;
  StringPtr part_local;
  
  part_local.content.size_ = (size_t)part.content.ptr;
  f_1.exception = (Exception *)&part_local;
  part_local.content.ptr = (char *)this;
  kj::_::DebugExpression<kj::StringPtr&>::operator!=
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[1]> *)&f,
             (DebugExpression<kj::StringPtr&> *)&f_1,(char (*) [1])0x524569);
  sVar1 = part_local.content.size_;
  __s = part_local.content.ptr;
  if (local_48 == '\x01') {
    if (part_local.content.size_ == 3) {
      local_71 = part_local.content.ptr[2] != '\0' || *(short *)part_local.content.ptr != 0x2e2e;
      if (part_local.content.ptr[2] != '\0' || *(short *)part_local.content.ptr != 0x2e2e)
      goto LAB_004be99b;
      goto LAB_004be939;
    }
    if ((part_local.content.size_ != 2) || (*(short *)part_local.content.ptr != 0x2e)) {
LAB_004be99b:
      f.exception = (Exception *)strlen(part_local.content.ptr);
      if (f.exception != (Exception *)(sVar1 - 1)) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&,char_const(&)[32],kj::StringPtr&>
                  (&f_1,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0x134,FAILED,"strlen(part.begin()) == part.size()",
                   "_kjCondition,\"NUL character in path component\", part",
                   (DebugComparison<unsigned_long,_unsigned_long> *)&f,
                   (char (*) [32])"NUL character in path component",&part_local);
        kj::_::Debug::Fault::fatal(&f_1);
      }
      pvVar2 = memchr(__s,0x2f,(size_t)f.exception);
      if (pvVar2 == (void *)0x0) {
        return;
      }
      f.exception._0_1_ = 1;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<unsigned_long>,kj::None_const&>&,char_const(&)[68],kj::StringPtr&>
                (&f_1,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x136,FAILED,"part.findFirst(\'/\') == kj::none",
                 "_kjCondition,\"\'/\' character in path component; did you mean to use Path::parse()?\", part"
                 ,(DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&> *)&f,
                 (char (*) [68])
                 "\'/\' character in path component; did you mean to use Path::parse()?",&part_local
                );
      kj::_::Debug::Fault::fatal(&f_1);
    }
  }
  local_71 = false;
LAB_004be939:
  kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[23],kj::StringPtr&>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
             ,0x133,FAILED,"part != \"\" && part != \".\" && part != \"..\"",
             "_kjCondition,\"invalid path component\", part",&local_71,
             (char (*) [23])"invalid path component",&part_local);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

void Path::validatePart(StringPtr part) {
  KJ_REQUIRE(part != "" && part != "." && part != "..", "invalid path component", part);
  KJ_REQUIRE(strlen(part.begin()) == part.size(), "NUL character in path component", part);
  KJ_REQUIRE(part.findFirst('/') == kj::none,
      "'/' character in path component; did you mean to use Path::parse()?", part);
}